

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

VP8LEncoder * VP8LEncoderNew(WebPConfig *config,WebPPicture *picture)

{
  WebPPicture *in_RSI;
  WebPConfig *in_RDI;
  VP8LEncoder *enc;
  size_t in_stack_ffffffffffffffe0;
  VP8LEncoder *local_8;
  
  local_8 = (VP8LEncoder *)WebPSafeCalloc((uint64_t)in_RSI,in_stack_ffffffffffffffe0);
  if (local_8 == (VP8LEncoder *)0x0) {
    WebPEncodingSetError(in_RSI,VP8_ENC_ERROR_OUT_OF_MEMORY);
    local_8 = (VP8LEncoder *)0x0;
  }
  else {
    local_8->config_ = in_RDI;
    local_8->pic_ = in_RSI;
    local_8->argb_content_ = kEncoderNone;
    VP8LEncDspInit();
  }
  return local_8;
}

Assistant:

static VP8LEncoder* VP8LEncoderNew(const WebPConfig* const config,
                                   const WebPPicture* const picture) {
  VP8LEncoder* const enc = (VP8LEncoder*)WebPSafeCalloc(1ULL, sizeof(*enc));
  if (enc == NULL) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    return NULL;
  }
  enc->config_ = config;
  enc->pic_ = picture;
  enc->argb_content_ = kEncoderNone;

  VP8LEncDspInit();

  return enc;
}